

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

void __thiscall
icu_63::CalendarAstronomer::getSunLongitude
          (CalendarAstronomer *this,double jDay,double *longitude,double *meanAnomaly)

{
  double dVar1;
  double epochAngle;
  double day;
  double *meanAnomaly_local;
  double *longitude_local;
  double jDay_local;
  CalendarAstronomer *this_local;
  
  dVar1 = norm2PI((jDay - 2447891.5) * 0.017202791632524146);
  dVar1 = norm2PI((dVar1 + 4.87650757829735) - 4.935239984568769);
  *meanAnomaly = dVar1;
  dVar1 = trueAnomaly(*meanAnomaly,0.016713);
  dVar1 = norm2PI(dVar1 + 4.935239984568769);
  *longitude = dVar1;
  return;
}

Assistant:

void CalendarAstronomer::getSunLongitude(double jDay, double &longitude, double &meanAnomaly)
{
    // See page 86 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    double day = jDay - JD_EPOCH;       // Days since epoch

    // Find the angular distance the sun in a fictitious
    // circular orbit has travelled since the epoch.
    double epochAngle = norm2PI(CalendarAstronomer_PI2/TROPICAL_YEAR*day);

    // The epoch wasn't at the sun's perigee; find the angular distance
    // since perigee, which is called the "mean anomaly"
    meanAnomaly = norm2PI(epochAngle + SUN_ETA_G - SUN_OMEGA_G);

    // Now find the "true anomaly", e.g. the real solar longitude
    // by solving Kepler's equation for an elliptical orbit
    // NOTE: The 3rd ed. of the book lists omega_g and eta_g in different
    // equations; omega_g is to be correct.
    longitude =  norm2PI(trueAnomaly(meanAnomaly, SUN_E) + SUN_OMEGA_G);
}